

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void CoOccurrenceFindMax(uint32_t *cooccurrence,uint32_t num_colors,uint8_t *c1,uint8_t *c2)

{
  uint32_t sum;
  uint32_t best_cooccurrence;
  uint32_t j;
  uint32_t i;
  uint32_t best_sum;
  uint8_t *c2_local;
  uint8_t *c1_local;
  uint32_t num_colors_local;
  uint32_t *cooccurrence_local;
  
  best_sum = 0;
  *c1 = '\0';
  for (i = 0; i < num_colors; i = i + 1) {
    sum = 0;
    for (j = 0; j < num_colors; j = j + 1) {
      sum = cooccurrence[i * num_colors + j] + sum;
    }
    if (best_sum < sum) {
      best_sum = sum;
      *c1 = (uint8_t)i;
    }
  }
  *c2 = '\0';
  best_cooccurrence = 0;
  for (i = 0; i < num_colors; i = i + 1) {
    if (best_cooccurrence < cooccurrence[*c1 * num_colors + i]) {
      best_cooccurrence = cooccurrence[*c1 * num_colors + i];
      *c2 = (uint8_t)i;
    }
  }
  return;
}

Assistant:

static void CoOccurrenceFindMax(const uint32_t* const cooccurrence,
                                uint32_t num_colors, uint8_t* const c1,
                                uint8_t* const c2) {
  // Find the index that is most frequently located adjacent to other
  // (different) indexes.
  uint32_t best_sum = 0u;
  uint32_t i, j, best_cooccurrence;
  *c1 = 0u;
  for (i = 0; i < num_colors; ++i) {
    uint32_t sum = 0;
    for (j = 0; j < num_colors; ++j) sum += cooccurrence[i * num_colors + j];
    if (sum > best_sum) {
      best_sum = sum;
      *c1 = i;
    }
  }
  // Find the index that is most frequently found adjacent to *c1.
  *c2 = 0u;
  best_cooccurrence = 0u;
  for (i = 0; i < num_colors; ++i) {
    if (cooccurrence[*c1 * num_colors + i] > best_cooccurrence) {
      best_cooccurrence = cooccurrence[*c1 * num_colors + i];
      *c2 = i;
    }
  }
  assert(*c1 != *c2);
}